

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O1

bool __thiscall Js::ByteCodeWriter::DoProfileNewScObjArrayOp(ByteCodeWriter *this,OpCode op)

{
  FunctionBody *pFVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  pFVar1 = this->m_functionWrite;
  if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase,sourceContextId,
                            ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if ((bVar4) ||
     (((pUVar2 = (this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.
                 m_utf8SourceInfo.ptr, (pUVar2->debugModeSource).ptr != (uchar *)0x0 ||
       ((pUVar2->field_0xa8 & 0x20) != 0)) && ((pUVar2->field_0xa8 & 0x40) != 0)))) {
    bVar4 = false;
  }
  else {
    bVar4 = (op - NewScObjArray & 0xfffd) == 0;
  }
  return bVar4;
}

Assistant:

bool DoProfileNewScObjArrayOp(OpCode op)
        {
            return
                !PHASE_OFF(NativeArrayPhase, m_functionWrite) &&
                !m_functionWrite->IsInDebugMode() &&
                (op == OpCode::NewScObjArray || op == OpCode::NewScObjArraySpread);
        }